

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

TestRequest *
anon_unknown.dwarf_334836::createTestRequest
          (TestRequest *__return_storage_ptr__,char *sender,char *target,int seq,char *id)

{
  undefined1 *this;
  int iVar1;
  allocator<char> local_91;
  FieldBase local_90;
  STRING local_38;
  
  FIX42::TestRequest::TestRequest(__return_storage_ptr__);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"HELLO",&local_91);
  FIX::TestReqID::TestReqID((TestReqID *)&local_90,&local_38);
  FIX42::TestRequest::set(__return_storage_ptr__,(TestReqID *)&local_90);
  FIX::FieldBase::~FieldBase(&local_90);
  std::__cxx11::string::~string((string *)&local_38);
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,"ISLD","TW",(int)sender);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&local_90,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&local_90,true);
  FIX::FieldBase::~FieldBase(&local_90);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&local_90,iVar1);
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,&local_90,true);
  FIX::FieldBase::~FieldBase(&local_90);
  return __return_storage_ptr__;
}

Assistant:

FIX42::TestRequest createTestRequest(const char *sender, const char *target, int seq, const char *id) {
  FIX42::TestRequest testRequest;
  testRequest.set(TestReqID(id));
  fillHeader(testRequest.getHeader(), sender, target, seq);
  testRequest.getHeader().setField(BodyLength(testRequest.bodyLength()));
  testRequest.getTrailer().setField(CheckSum(testRequest.checkSum()));
  return testRequest;
}